

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O3

SQRESULT sqstd_dofile(HSQUIRRELVM v,SQChar *filename,SQBool retval,SQBool printerror)

{
  long lVar1;
  SQRESULT SVar2;
  SQRESULT SVar3;
  
  lVar1 = sq_gettop();
  if (lVar1 != 0) {
    SVar2 = sqstd_loadfile(v,filename,printerror);
    SVar3 = -1;
    if (-1 < SVar2) {
      sq_push(v,0xfffffffffffffffe);
      SVar3 = 1;
      lVar1 = sq_call(v,1,retval,1);
      if (lVar1 < 0) {
        sq_pop(v,1);
        SVar3 = -1;
      }
      else {
        sq_remove(v,(ulong)(retval == 0) | 0xfffffffffffffffe);
      }
    }
    return SVar3;
  }
  SVar2 = sq_throwerror(v,"environment table expected");
  return SVar2;
}

Assistant:

SQRESULT sqstd_dofile(HSQUIRRELVM v,const SQChar *filename,SQBool retval,SQBool printerror)
{
    //at least one entry must exist in order for us to push it as the environment
    if(sq_gettop(v) == 0)
        return sq_throwerror(v,_SC("environment table expected"));

    if(SQ_SUCCEEDED(sqstd_loadfile(v,filename,printerror))) {
        sq_push(v,-2);
        if(SQ_SUCCEEDED(sq_call(v,1,retval,SQTrue))) {
            sq_remove(v,retval?-2:-1); //removes the closure
            return 1;
        }
        sq_pop(v,1); //removes the closure
    }
    return SQ_ERROR;
}